

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

char16_t * QtPrivate::qustrchr(QStringView str,char16_t c)

{
  char16_t *pcVar1;
  __m128i data_00;
  anon_class_16_2_94731f9e loopCheck;
  undefined1 auVar2 [16];
  bool bVar3;
  storage_type_conflict *returnIfExited;
  qsizetype qVar4;
  undefined2 in_DX;
  long in_FS_OFFSET;
  __m128i data_1;
  __m128i data;
  char16_t *next;
  __m128i mch;
  bool loops;
  char16_t *e;
  char16_t *n;
  anon_class_32_2_de32c99c hasMatch;
  QStringView *this;
  undefined8 in_stack_fffffffffffffef8;
  longlong in_stack_ffffffffffffff00;
  anon_class_8_1_54a3980e in_stack_ffffffffffffff08;
  anon_class_32_2_de32c99c *in_stack_ffffffffffffff10;
  char16_t *pcVar5;
  undefined8 uVar6;
  char16_t *local_b0;
  char16_t *local_50;
  QStringView local_48;
  char16_t *local_38;
  char16_t **local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_48;
  returnIfExited = QStringView::utf16(this);
  local_50 = returnIfExited;
  qVar4 = QStringView::size(this);
  pcVar1 = returnIfExited + qVar4;
  uVar6 = CONCAT44(CONCAT22(in_DX,in_DX),CONCAT22(in_DX,in_DX));
  local_10 = 0xaaaaaaaaaaaaaaaa;
  local_18 = &local_50;
  pcVar5 = local_50;
  do {
    local_50 = pcVar5;
    pcVar5 = local_50 + 8;
    if (pcVar1 < pcVar5) {
      if (3 < (long)pcVar1 - (long)local_50 >> 1) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = in_stack_ffffffffffffff08.n;
        bVar3 = qustrchr::anon_class_32_2_de32c99c::operator()
                          (in_stack_ffffffffffffff10,(__m128i)(auVar2 << 0x40),
                           (ushort)((ulong)*(longlong *)local_50 >> 0x30));
        if (bVar3) {
          local_b0 = local_50;
          goto LAB_001503c5;
        }
        local_50 = local_50 + 4;
      }
      local_38 = local_50;
      loopCheck._8_8_ = uVar6;
      loopCheck.n = pcVar5;
      local_b0 = (anonymous_namespace)::UnrollTailLoop<3u>::
                 exec<char16_t_const*,QtPrivate::qustrchr(QStringView,char16_t)::__1,QtPrivate::qustrchr(QStringView,char16_t)::__2,long>
                           ((long)local_50,returnIfExited,loopCheck,in_stack_ffffffffffffff08,
                            (long)this);
      goto LAB_001503c5;
    }
    in_stack_ffffffffffffff08.n = *local_50;
    in_stack_ffffffffffffff10 = *(anon_class_32_2_de32c99c **)(local_50 + 4);
    data_00[1] = (longlong)in_stack_ffffffffffffff08.n;
    data_00[0] = in_stack_ffffffffffffff00;
    bVar3 = qustrchr::anon_class_32_2_de32c99c::operator()
                      (in_stack_ffffffffffffff10,data_00,
                       (ushort)((ulong)in_stack_fffffffffffffef8 >> 0x30));
  } while (!bVar3);
  local_b0 = local_50;
LAB_001503c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b0;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
const char16_t *QtPrivate::qustrchr(QStringView str, char16_t c) noexcept
{
    const char16_t *n = str.utf16();
    const char16_t *e = n + str.size();

#ifdef __SSE2__
    bool loops = true;
    // Using the PMOVMSKB instruction, we get two bits for each character
    // we compare.
    __m128i mch;
    if constexpr (UseAvx2) {
        // we're going to read n[0..15] (32 bytes)
        __m256i mch256 = _mm256_set1_epi32(c | (c << 16));
        for (const char16_t *next = n + 16; next <= e; n = next, next += 16) {
            __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(n));
            __m256i result = _mm256_cmpeq_epi16(data, mch256);
            uint mask = uint(_mm256_movemask_epi8(result));
            if (mask) {
                uint idx = qCountTrailingZeroBits(mask);
                return n + idx / 2;
            }
        }
        loops = false;
        mch = _mm256_castsi256_si128(mch256);
    } else {
        mch = _mm_set1_epi32(c | (c << 16));
    }

    auto hasMatch = [mch, &n](__m128i data, ushort validityMask) {
        __m128i result = _mm_cmpeq_epi16(data, mch);
        uint mask = uint(_mm_movemask_epi8(result));
        if ((mask & validityMask) == 0)
            return false;
        uint idx = qCountTrailingZeroBits(mask);
        n += idx / 2;
        return true;
    };

    // we're going to read n[0..7] (16 bytes)
    for (const char16_t *next = n + 8; next <= e; n = next, next += 8) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(n));
        if (hasMatch(data, 0xffff))
            return n;

        if (!loops) {
            n += 8;
            break;
        }
    }

#  if !defined(__OPTIMIZE_SIZE__)
    // we're going to read n[0..3] (8 bytes)
    if (e - n > 3) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(n));
        if (hasMatch(data, 0xff))
            return n;

        n += 4;
    }

    return UnrollTailLoop<3>::exec(e - n, e,
                                   [=](qsizetype i) { return n[i] == c; },
                                   [=](qsizetype i) { return n + i; });
#  endif
#elif defined(__ARM_NEON__)
    const uint16x8_t vmask = qvsetq_n_u16(1, 1 << 1, 1 << 2, 1 << 3, 1 << 4, 1 << 5, 1 << 6, 1 << 7);
    const uint16x8_t ch_vec = vdupq_n_u16(c);
    for (const char16_t *next = n + 8; next <= e; n = next, next += 8) {
        uint16x8_t data = vld1q_u16(reinterpret_cast<const uint16_t *>(n));
        uint mask = vaddvq_u16(vandq_u16(vceqq_u16(data, ch_vec), vmask));
        if (ushort(mask)) {
            // found a match
            return n + qCountTrailingZeroBits(mask);
        }
    }
#endif // aarch64

    return std::find(n, e, c);
}